

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::SimpleTypeHandler<6UL>::MarkObjectSlots_TTD
          (SimpleTypeHandler<6UL> *this,SnapshotExtractor *extractor,DynamicObject *obj)

{
  uint uVar1;
  bool bVar2;
  PropertyId pid_00;
  PropertyRecord *this_00;
  Var var;
  Var value;
  uint local_28;
  PropertyId pid;
  uint32 index;
  uint32 plength;
  DynamicObject *obj_local;
  SnapshotExtractor *extractor_local;
  SimpleTypeHandler<6UL> *this_local;
  
  uVar1 = this->propertyCount;
  for (local_28 = 0; local_28 < uVar1; local_28 = local_28 + 1) {
    this_00 = Memory::WriteBarrierPtr<const_Js::PropertyRecord>::operator->
                        (&this->descriptors[local_28].Id);
    pid_00 = PropertyRecord::GetPropertyId(this_00);
    bVar2 = DynamicTypeHandler::ShouldMarkPropertyId_TTD(pid_00);
    if (bVar2 && (this->descriptors[local_28].field_1.Attributes & 8) == 0) {
      var = DynamicObject::GetSlot(obj,local_28);
      TTD::SnapshotExtractor::MarkVisitVar(extractor,var);
    }
  }
  return;
}

Assistant:

void SimpleTypeHandler<size>::MarkObjectSlots_TTD(TTD::SnapshotExtractor* extractor, DynamicObject* obj) const
    {
        uint32 plength = this->propertyCount;

        for(uint32 index = 0; index < plength; ++index)
        {
            Js::PropertyId pid = this->descriptors[index].Id->GetPropertyId();

            if(DynamicTypeHandler::ShouldMarkPropertyId_TTD(pid) & !(this->descriptors[index].Attributes & PropertyDeleted))
            {
                Js::Var value = obj->GetSlot(index);
                extractor->MarkVisitVar(value);
            }
        }
    }